

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
Parfait::UgridReader::readPyramids
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,string *filename,int begin,
          int end,bool swapBytes)

{
  int *piVar1;
  int *vertex;
  FILE *__stream;
  int *piVar2;
  domain_error *this;
  vector<int,_std::allocator<int>_> *__range1;
  undefined7 in_register_00000081;
  ulong uVar3;
  size_type __n;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  allocator_type local_99;
  int ntet;
  int nquad;
  int ntri;
  int nnodes;
  ulong local_88;
  int nhex;
  int nprism;
  int npyr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  uVar3 = CONCAT71(in_register_00000081,swapBytes) & 0xffffffff;
  std::__cxx11::string::string((string *)&local_50,(string *)filename);
  local_88 = uVar3;
  readHeader(&local_50,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,SUB81(uVar3,0));
  std::__cxx11::string::~string((string *)&local_50);
  uVar4 = end - begin;
  __n = (size_type)(int)(uVar4 * 5);
  local_70._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict2 *)&local_70,&local_99);
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,(long)nnodes * 0x18 +
                   ((long)(begin * 5) + (long)ntri * 4 + (long)nquad * 5 + (long)ntet * 4) * 4 +
                   0x1c,0);
    fread((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start,4,__n,__stream);
    fclose(__stream);
    if ((char)local_88 != '\0') {
      lVar5 = 0;
      while (bVar7 = __n != 0, __n = __n - 1, bVar7) {
        bswap_32((void *)((long)(__return_storage_ptr__->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + 4;
      }
    }
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar2 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar2 != piVar1; piVar2 = piVar2 + 1) {
      *piVar2 = *piVar2 + -1;
    }
    uVar6 = 0;
    uVar3 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar3 = uVar6;
    }
    for (; uVar3 * 0x14 - uVar6 != 0; uVar6 = uVar6 + 0x14) {
      AflrToCGNS::convertPyramid<int>
                ((int *)((long)(__return_storage_ptr__->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + uVar6));
    }
    return __return_storage_ptr__;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"Could not open .ugrid file: ",filename);
  std::domain_error::domain_error(this,(string *)&local_70);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline std::vector<int> Parfait::UgridReader::readPyramids(std::string filename,int begin,int end,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    // get header info and allocate space for triangles
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);
    int nrequested = end - begin;
    std::vector<int> pyrs(5*nrequested,0);

    FILE *f = fopen(filename.c_str(),"rb");
    if(f == NULL){
        throw std::domain_error("Could not open .ugrid file: "+filename);
    }
    unsigned long int byteOffset = 7*sizeof(int) + 3*nnodes*sizeof(double);
    byteOffset += 3*ntri*sizeof(int);
    byteOffset += 4*nquad*sizeof(int);
    byteOffset += (ntri+nquad)*sizeof(int);
    byteOffset += 4*ntet*sizeof(int);
    byteOffset += 5*begin*sizeof(int);
    fseek(f,byteOffset,SEEK_SET);
    fread(&pyrs[0],sizeof(int),5*nrequested,f);
    fclose(f);
    if(swapBytes) {
        for (size_t i = 0; i < 5 * nrequested; i++) {
            bswap_32(&pyrs[i]);
        }
    }

    for(int& vertex : pyrs)
        vertex--;

    for(int i = 0; i < nrequested; i++)
        Parfait::AflrToCGNS::convertPyramid(&pyrs[5*i]);

    return pyrs;
}